

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tarray.h
# Opt level: O3

void __thiscall TArray<int,_int>::ShrinkToFit(TArray<int,_int> *this)

{
  uint uVar1;
  int *piVar2;
  
  uVar1 = this->Count;
  if (uVar1 < this->Most) {
    this->Most = uVar1;
    if (uVar1 == 0) {
      if (this->Array == (int *)0x0) {
        return;
      }
      M_Free(this->Array);
      piVar2 = (int *)0x0;
    }
    else {
      piVar2 = (int *)M_Realloc_Dbg(this->Array,(ulong)uVar1 << 2,
                                    "/workspace/llm4binary/github/license_c_cmakelists/alexey-lysiuk[P]gzdoom/src/tarray.h"
                                    ,0x1ad);
    }
    this->Array = piVar2;
  }
  return;
}

Assistant:

void ShrinkToFit ()
	{
		if (Most > Count)
		{
			Most = Count;
			if (Most == 0)
			{
				if (Array != NULL)
				{
					M_Free (Array);
					Array = NULL;
				}
			}
			else
			{
				DoResize ();
			}
		}
	}